

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O2

void __thiscall Renderer::drawSegment(Renderer *this,Vector3 *u,Vector3 *v,Mat *img,Scalar *color)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  Camera *this_00;
  double dis;
  double dVar6;
  double dVar7;
  undefined8 local_f0;
  Vector3 local_e8;
  undefined8 uStack_d0;
  undefined4 local_c0 [2];
  Mat *local_b8;
  undefined8 local_b0;
  Vector3 local_a8;
  Vector3 vec;
  Vector3 pos;
  Ray seg;
  
  operator-(v,u);
  Ray::Ray(&seg,u,&local_e8);
  operator-(v,u);
  dVar1 = Vector3::len(&local_e8);
  dVar2 = dVar1 / 50.0;
  if (dVar2 <= 0.01) {
    dVar2 = 0.01;
  }
  this_00 = &(this->world).camera;
  for (dis = 0.0; dis <= dVar1; dis = dis + dVar2) {
    Ray::travel(&vec,&seg,dis);
    local_a8.x = vec.x;
    local_a8.y = vec.y;
    local_a8.z = vec.z;
    Camera::getPixelPos(&pos,this_00,&local_a8);
    operator-(&this_00->O,&vec);
    dVar3 = World::getRadianceWithLight(&this->world,&vec,&local_e8,&this_00->O);
    local_b0 = 0;
    dVar4 = dVar3 * 0.9 + 0.1;
    local_c0[0] = 0x3010000;
    local_b8 = img;
    pdVar5 = Vector3::operator[](&pos,0);
    dVar3 = *pdVar5;
    pdVar5 = Vector3::operator[](&pos,1);
    local_f0 = CONCAT44((int)*pdVar5,(int)dVar3);
    dVar6 = _color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] * dVar4;
    dVar7 = _color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] * dVar4;
    dVar3 = dVar4 * _color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
    dVar4 = dVar4 * _color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_e8);
    local_e8.x = dVar6;
    local_e8.y = dVar7;
    uStack_d0 = dVar4;
    local_e8.z = dVar3;
    cv::circle(local_c0,&local_f0,2,&local_e8,0xffffffffffffffff,8,0);
  }
  return;
}

Assistant:

void Renderer::drawSegment(Vector3 u, Vector3 v, Mat &img, Scalar color)
{
    Ray seg(u, v - u);
    //cout << u << '\t' << v << endl;
    double len = (v - u).len(), intvl = max(0.01, len / 50);
    for (double t = 0; t <= len; t += intvl) {
        Vector3 vec(seg.travel(t));
        Vector3 pos = world.camera.getPixelPos(vec);
        double tmp = (0.1 + 0.9*world.getRadianceWithLight(vec, world.camera.O - vec, world.camera.O));// + 0.7/(world.camera.O - vec).len()*3);
        cv::circle(img, cv::Point(pos[0], pos[1]), 2, _color* tmp/* + (1-tmp)*Scalar(res.at<Vec3b>(min(max(0, (int)pos[1]), H), min(max(0, (int)pos[0]), H)))*/, -1);
    }
}